

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

void prf_state_copy(prf_state_t *copy,prf_state_t *original)

{
  matrix4x4_f32_t *paafVar1;
  matrix4x4_f32_t *paafVar2;
  prf_node_t *ppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint uVar14;
  int iVar15;
  prf_node_t **pppVar16;
  void *elem;
  matrix4x4_f32_t **ppaafVar17;
  ulong uVar18;
  bool bVar19;
  
  ppVar3 = original->node;
  copy->model = original->model;
  copy->node = ppVar3;
  copy->object_transparency = original->object_transparency;
  copy->object_flags = original->object_flags;
  ppVar3 = original->vertex_palette;
  copy->header = original->header;
  copy->vertex_palette = ppVar3;
  ppVar3 = original->material_palette;
  copy->color_palette = original->color_palette;
  copy->material_palette = ppVar3;
  copy->inv_dirty = original->inv_dirty;
  uVar14 = prf_array_count(original->materials);
  pppVar16 = (prf_node_t **)prf_array_set_count(copy->materials,0);
  copy->materials = pppVar16;
  if (0 < (int)uVar14) {
    uVar18 = 0;
    do {
      pppVar16 = (prf_node_t **)prf_array_append_ptr(copy->materials,original->materials[uVar18]);
      copy->materials = pppVar16;
      uVar18 = uVar18 + 1;
    } while (uVar14 != uVar18);
  }
  uVar14 = prf_array_count(original->textures);
  pppVar16 = (prf_node_t **)prf_array_set_count(copy->textures,0);
  copy->textures = pppVar16;
  if (0 < (int)uVar14) {
    uVar18 = 0;
    do {
      pppVar16 = (prf_node_t **)prf_array_append_ptr(copy->textures,original->textures[uVar18]);
      copy->textures = pppVar16;
      uVar18 = uVar18 + 1;
    } while (uVar14 != uVar18);
  }
  uVar14 = prf_array_count(original->instances);
  pppVar16 = (prf_node_t **)prf_array_set_count(copy->instances,0);
  copy->instances = pppVar16;
  if (0 < (int)uVar14) {
    uVar18 = 0;
    do {
      pppVar16 = (prf_node_t **)prf_array_append_ptr(copy->instances,original->instances[uVar18]);
      copy->instances = pppVar16;
      uVar18 = uVar18 + 1;
    } while (uVar14 != uVar18);
  }
  prf_array_count(original->matrix);
  uVar18 = 0;
  do {
    iVar15 = prf_array_count(copy->matrix);
    if ((long)iVar15 <= (long)uVar18) {
      elem = malloc(0x40);
      if (elem == (void *)0x0) {
        prf_error(9,"memory allocation failure (malloc returned NULL)");
        return;
      }
      ppaafVar17 = (matrix4x4_f32_t **)prf_array_append_ptr(copy->matrix,elem);
      copy->matrix = ppaafVar17;
    }
    paafVar1 = copy->matrix[uVar18];
    paafVar2 = original->matrix[uVar18];
    uVar4 = *(undefined8 *)(*paafVar2)[0];
    uVar5 = *(undefined8 *)((*paafVar2)[0] + 2);
    uVar6 = *(undefined8 *)(*paafVar2)[1];
    uVar7 = *(undefined8 *)((*paafVar2)[1] + 2);
    uVar8 = *(undefined8 *)(*paafVar2)[2];
    uVar9 = *(undefined8 *)((*paafVar2)[2] + 2);
    uVar10 = *(undefined8 *)((*paafVar2)[3] + 2);
    *(undefined8 *)(*paafVar1)[3] = *(undefined8 *)(*paafVar2)[3];
    *(undefined8 *)((*paafVar1)[3] + 2) = uVar10;
    *(undefined8 *)(*paafVar1)[2] = uVar8;
    *(undefined8 *)((*paafVar1)[2] + 2) = uVar9;
    *(undefined8 *)(*paafVar1)[1] = uVar6;
    *(undefined8 *)((*paafVar1)[1] + 2) = uVar7;
    *(undefined8 *)(*paafVar1)[0] = uVar4;
    *(undefined8 *)((*paafVar1)[0] + 2) = uVar5;
    bVar19 = uVar18 < original->state_push_level;
    uVar18 = uVar18 + 1;
  } while (bVar19);
  if (copy->inv_dirty == 0) {
    paafVar1 = copy->inv_matrix;
    paafVar2 = original->inv_matrix;
    uVar4 = *(undefined8 *)(*paafVar2)[0];
    uVar5 = *(undefined8 *)((*paafVar2)[0] + 2);
    uVar6 = *(undefined8 *)(*paafVar2)[1];
    uVar7 = *(undefined8 *)((*paafVar2)[1] + 2);
    uVar8 = *(undefined8 *)(*paafVar2)[2];
    uVar9 = *(undefined8 *)((*paafVar2)[2] + 2);
    uVar10 = *(undefined8 *)((*paafVar2)[3] + 2);
    *(undefined8 *)(*paafVar1)[3] = *(undefined8 *)(*paafVar2)[3];
    *(undefined8 *)((*paafVar1)[3] + 2) = uVar10;
    *(undefined8 *)(*paafVar1)[2] = uVar8;
    *(undefined8 *)((*paafVar1)[2] + 2) = uVar9;
    *(undefined8 *)(*paafVar1)[1] = uVar6;
    *(undefined8 *)((*paafVar1)[1] + 2) = uVar7;
    *(undefined8 *)(*paafVar1)[0] = uVar4;
    *(undefined8 *)((*paafVar1)[0] + 2) = uVar5;
  }
  uVar11 = original->subface_level;
  uVar12 = original->attribute_level;
  uVar13 = original->extension_level;
  copy->push_level = original->push_level;
  copy->subface_level = uVar11;
  copy->attribute_level = uVar12;
  copy->extension_level = uVar13;
  uVar11 = original->physical_level;
  copy->state_push_level = original->state_push_level;
  copy->physical_level = uVar11;
  return;
}

Assistant:

void
prf_state_copy(
    prf_state_t * copy,
    prf_state_t * original )
{
    int cnt, i;
    assert( copy != NULL && original != NULL );
    copy->model = original->model;
    copy->node = original->node;
    copy->object_transparency = original->object_transparency;
    copy->object_flags = original->object_flags;
    copy->header = original->header;
    copy->vertex_palette = original->vertex_palette;
    copy->color_palette = original->color_palette;
    copy->material_palette = original->material_palette;
    copy->inv_dirty = original->inv_dirty;

    cnt = prf_array_count( original->materials );
    copy->materials = (prf_node_t **)prf_array_set_count( copy->materials, 0 );
    for ( i = 0; i < cnt; i++ ) {
      copy->materials = (prf_node_t **)
	prf_array_append_ptr( copy->materials, original->materials[i] );
    }

    cnt = prf_array_count( original->textures );
    copy->textures = (prf_node_t **)prf_array_set_count( copy->textures, 0 );
    for ( i = 0; i < cnt; i++ ) {
      copy->textures = (prf_node_t **)
	prf_array_append_ptr( copy->textures, original->textures[i] );
    }

    cnt = prf_array_count( original->instances );
    copy->instances = (prf_node_t **)prf_array_set_count( copy->instances, 0 );
    for ( i = 0; i < cnt; i++ ) {
      copy->instances = (prf_node_t **)
	prf_array_append_ptr( copy->instances, original->instances[i] );
    }
    


    cnt = prf_array_count( original->matrix );
    
    for ( i = 0; i <= original->state_push_level; i++ ) {
        if ( i >= prf_array_count( copy->matrix ) ) {
            matrix4x4_f32_t * m;
            m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
            if ( m == NULL ) {
                prf_error( 9,
                    "memory allocation failure (malloc returned NULL)" );
                return;
            }
            copy->matrix = 
	      (matrix4x4_f32_t **)prf_array_append_ptr( copy->matrix, m );
        }
        memcpy( copy->matrix[i], original->matrix[i],
            sizeof( matrix4x4_f32_t ) );
    }

    if ( copy->inv_dirty == FALSE )
        memcpy( copy->inv_matrix, original->inv_matrix,
            sizeof( matrix4x4_f32_t ) );

    copy->push_level = original->push_level;
    copy->subface_level = original->subface_level;
    copy->extension_level = original->extension_level;
    copy->attribute_level = original->attribute_level;

    copy->state_push_level = original->state_push_level;
    copy->physical_level = original->physical_level;

}